

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test5::getSwizzleTypeProperties
          (GPUShaderFP64Test5 *this,_swizzle_type type,string *out_swizzle_string,
          uint *out_n_components,uint *out_component_order)

{
  TestError *this_00;
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint result_component_order [4];
  string result_swizzle_string;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_58 = 0;
  uStack_50 = 0;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  switch(type) {
  case SWIZZLE_TYPE_NONE:
    uVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1b3c1e9);
    goto LAB_00942bcb;
  case SWIZZLE_TYPE_XWZY:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e90d);
    uVar2 = 0;
    uVar3 = 3;
    uVar4 = 2;
    uVar5 = 1;
    break;
  case SWIZZLE_TYPE_XZXY:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e912);
    uVar2 = 0;
    uVar3 = 2;
    uVar4 = 0;
    uVar5 = 1;
    break;
  case SWIZZLE_TYPE_XZY:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e917);
    local_58 = 0x200000000;
    uStack_50 = CONCAT44(uStack_50._4_4_,1);
    goto LAB_00942aea;
  case SWIZZLE_TYPE_XZYW:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e91b);
    uVar2 = 0;
    uVar3 = 2;
    uVar4 = 1;
    uVar5 = 3;
    break;
  case SWIZZLE_TYPE_Y:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1b1d1a9);
    local_58 = CONCAT44(local_58._4_4_,1);
    goto LAB_00942b3e;
  case SWIZZLE_TYPE_YX:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1c0a01a);
    local_58 = 1;
    goto LAB_00942b97;
  case SWIZZLE_TYPE_YXX:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e920);
    local_58 = 1;
    uStack_50 = uStack_50 & 0xffffffff00000000;
LAB_00942aea:
    uVar1 = 3;
    goto LAB_00942bcb;
  case SWIZZLE_TYPE_YXXY:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e924);
    uVar2 = 1;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 1;
    break;
  case SWIZZLE_TYPE_Z:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1af9603);
    local_58 = CONCAT44(local_58._4_4_,2);
    goto LAB_00942b3e;
  case SWIZZLE_TYPE_ZY:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1a8e90f);
    local_58 = 0x100000002;
    goto LAB_00942b97;
  case SWIZZLE_TYPE_W:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1ad8c38);
    local_58 = CONCAT44(local_58._4_4_,3);
LAB_00942b3e:
    uVar1 = 1;
    goto LAB_00942bcb;
  case SWIZZLE_TYPE_WX:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1c37c64);
    local_58 = 3;
LAB_00942b97:
    uVar1 = 2;
    goto LAB_00942bcb;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized swizzle type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1daa);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_58 = CONCAT44(uVar3,uVar2);
  uStack_50 = CONCAT44(uVar5,uVar4);
  uVar1 = 4;
LAB_00942bcb:
  if (out_swizzle_string != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)out_swizzle_string);
  }
  if (out_n_components != (uint *)0x0) {
    *out_n_components = uVar1;
  }
  if (out_component_order != (uint *)0x0) {
    memcpy(out_component_order,&local_58,(ulong)(uVar1 << 2));
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test5::getSwizzleTypeProperties(_swizzle_type type, std::string* out_swizzle_string,
												  unsigned int* out_n_components, unsigned int* out_component_order)
{
	unsigned int result_component_order[4] = { 0 };
	unsigned int result_n_components	   = 0;
	std::string  result_swizzle_string;

	switch (type)
	{
	case SWIZZLE_TYPE_NONE:
	{
		result_swizzle_string = "";
		result_n_components   = 0;

		break;
	}

	case SWIZZLE_TYPE_XWZY:
	{
		result_swizzle_string	 = "xwzy";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 3;
		result_component_order[2] = 2;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZXY:
	{
		result_swizzle_string	 = "xzxy";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 0;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZY:
	{
		result_swizzle_string	 = "xzy";
		result_n_components		  = 3;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZYW:
	{
		result_swizzle_string	 = "xzyw";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 1;
		result_component_order[3] = 3;

		break;
	}

	case SWIZZLE_TYPE_Y:
	{
		result_swizzle_string	 = "y";
		result_n_components		  = 1;
		result_component_order[0] = 1;

		break;
	}

	case SWIZZLE_TYPE_YX:
	{
		result_swizzle_string	 = "yx";
		result_n_components		  = 2;
		result_component_order[0] = 1;
		result_component_order[1] = 0;

		break;
	}

	case SWIZZLE_TYPE_YXX:
	{
		result_swizzle_string	 = "yxx";
		result_n_components		  = 3;
		result_component_order[0] = 1;
		result_component_order[1] = 0;
		result_component_order[2] = 0;

		break;
	}

	case SWIZZLE_TYPE_YXXY:
	{
		result_swizzle_string	 = "yxxy";
		result_n_components		  = 4;
		result_component_order[0] = 1;
		result_component_order[1] = 0;
		result_component_order[2] = 0;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_Z:
	{
		result_swizzle_string	 = "z";
		result_n_components		  = 1;
		result_component_order[0] = 2;

		break;
	}

	case SWIZZLE_TYPE_ZY:
	{
		result_swizzle_string	 = "zy";
		result_n_components		  = 2;
		result_component_order[0] = 2;
		result_component_order[1] = 1;

		break;
	}

	case SWIZZLE_TYPE_W:
	{
		result_swizzle_string	 = "w";
		result_n_components		  = 1;
		result_component_order[0] = 3;

		break;
	}

	case SWIZZLE_TYPE_WX:
	{
		result_swizzle_string	 = "wx";
		result_n_components		  = 2;
		result_component_order[0] = 3;
		result_component_order[1] = 0;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized swizzle type");
	}
	} /* switch (type) */

	if (out_swizzle_string != DE_NULL)
	{
		*out_swizzle_string = result_swizzle_string;
	}

	if (out_n_components != DE_NULL)
	{
		*out_n_components = result_n_components;
	}

	if (out_component_order != DE_NULL)
	{
		memcpy(out_component_order, result_component_order, sizeof(unsigned int) * result_n_components);
	}
}